

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

UCVarValue FBaseCVar::FromString(char *value,ECVarType type)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  GUID *pGVar4;
  bool bVar5;
  int iVar6;
  GUID *in_RAX;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  double dVar11;
  UCVarValue ret;
  undefined8 local_18;
  
  local_18._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  pGVar4 = in_RAX;
  switch(type) {
  case CVAR_Bool:
    iVar6 = strcasecmp(value,"true");
    local_18._1_7_ = (uint7)((ulong)in_RAX >> 8);
    if (iVar6 == 0) {
      local_18 = (GUID *)CONCAT71(local_18._1_7_,1);
      pGVar4 = local_18;
    }
    else {
      iVar6 = strcasecmp(value,"false");
      if (iVar6 == 0) {
        local_18 = (GUID *)((ulong)local_18._1_7_ << 8);
        pGVar4 = local_18;
      }
      else {
        lVar10 = strtol(value,(char **)0x0,0);
        local_18 = (GUID *)CONCAT71(local_18._1_7_,lVar10 != 0);
        pGVar4 = local_18;
      }
    }
    break;
  case CVAR_Int:
    iVar6 = strcasecmp(value,"true");
    if (iVar6 == 0) {
      local_18 = (GUID *)CONCAT44(local_18._4_4_,1);
      pGVar4 = local_18;
    }
    else {
      iVar6 = strcasecmp(value,"false");
      if (iVar6 == 0) {
        local_18 = (GUID *)((ulong)local_18._4_4_ << 0x20);
        pGVar4 = local_18;
      }
      else {
        lVar10 = strtol(value,(char **)0x0,0);
        local_18 = (GUID *)CONCAT44(local_18._4_4_,(int)lVar10);
        pGVar4 = local_18;
      }
    }
    break;
  case CVAR_Float:
    dVar11 = strtod(value,(char **)0x0);
    local_18 = (GUID *)CONCAT44(local_18._4_4_,(float)dVar11);
    pGVar4 = local_18;
    break;
  case CVAR_String:
    pGVar4 = (GUID *)value;
    break;
  case CVAR_GUID:
    local_18 = (GUID *)0x0;
    pGVar4 = local_18;
    if (value != (char *)0x0) {
      uVar8 = 0;
      do {
        pcVar1 = value + uVar8;
        uVar7 = uVar8 + 1;
        if (0x25 < uVar8) break;
        uVar8 = uVar7;
      } while (*pcVar1 != '\0');
      if (*pcVar1 == '\0' && uVar7 == 0x27) {
        lVar10 = 0;
        uVar8 = strtoul(value + 1,(char **)0x0,0x10);
        cGUID.Data1 = (DWORD)uVar8;
        uVar8 = strtoul(value + 10,(char **)0x0,0x10);
        cGUID.Data2 = (WORD)uVar8;
        uVar8 = strtoul(value + 0xf,(char **)0x0,0x10);
        cGUID.Data3 = (WORD)uVar8;
        cGUID.Data4[0] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x14];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[0] = bVar9 | cGUID.Data4[0] * '\x10';
          }
          else {
            cGUID.Data4[0] = cGUID.Data4[0] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[1] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x16];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[1] = bVar9 | cGUID.Data4[1] * '\x10';
          }
          else {
            cGUID.Data4[1] = cGUID.Data4[1] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[2] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x19];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[2] = bVar9 | cGUID.Data4[2] * '\x10';
          }
          else {
            cGUID.Data4[2] = cGUID.Data4[2] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[3] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x1b];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[3] = bVar9 | cGUID.Data4[3] * '\x10';
          }
          else {
            cGUID.Data4[3] = cGUID.Data4[3] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[4] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x1d];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[4] = bVar9 | cGUID.Data4[4] * '\x10';
          }
          else {
            cGUID.Data4[4] = cGUID.Data4[4] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[5] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x1f];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[5] = bVar9 | cGUID.Data4[5] * '\x10';
          }
          else {
            cGUID.Data4[5] = cGUID.Data4[5] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[6] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x21];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[6] = bVar9 | cGUID.Data4[6] * '\x10';
          }
          else {
            cGUID.Data4[6] = cGUID.Data4[6] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        lVar10 = 0;
        cGUID.Data4[7] = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          cVar2 = value[lVar10 + 0x23];
          bVar9 = cVar2 - 0x30;
          if ((bVar9 < 10) || (bVar9 = cVar2 + 0xbf, bVar9 < 6)) {
            cGUID.Data4[7] = bVar9 | cGUID.Data4[7] * '\x10';
          }
          else {
            cGUID.Data4[7] = cGUID.Data4[7] * '\x10' + cVar2 + 0x9f;
          }
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        local_18 = &cGUID;
        pGVar4 = local_18;
      }
    }
  }
  local_18 = pGVar4;
  return (UCVarValue)local_18.String;
}

Assistant:

UCVarValue FBaseCVar::FromString (const char *value, ECVarType type)
{
	UCVarValue ret;
	int i;

	switch (type)
	{
	case CVAR_Bool:
		if (stricmp (value, "true") == 0)
			ret.Bool = true;
		else if (stricmp (value, "false") == 0)
			ret.Bool = false;
		else
			ret.Bool = strtol (value, NULL, 0) != 0;
		break;

	case CVAR_Int:
		if (stricmp (value, "true") == 0)
			ret.Int = 1;
		else if (stricmp (value, "false") == 0)
			ret.Int = 0;
		else
			ret.Int = strtol (value, NULL, 0);
		break;

	case CVAR_Float:
		ret.Float = (float)strtod (value, NULL);
		break;

	case CVAR_String:
		ret.String = const_cast<char *>(value);
		break;

	case CVAR_GUID:
		// {xxxxxxxx-xxxx-xxxx-xxxx-xxxxxxxxxxxx}
		// 01234567890123456789012345678901234567
		// 0         1         2         3

		ret.pGUID = NULL;
		if (value == NULL)
		{
			break;
		}
		for (i = 0; value[i] != 0 && i < 38; i++)
		{
			switch (i)
			{
			case 0:
				if (value[i] != '{')
					break;
			case 9:
			case 14:
			case 19:
			case 24:
				if (value[i] != '-')
					break;
			case 37:
				if (value[i] != '}')
					break;
			default:
				if (value[i] < '0' || 
					(value[i] > '9' && value[i] < 'A') || 
					(value[i] > 'F' && value[i] < 'a') || 
					value[i] > 'f')
					break;
			}
		}
		if (i == 38 && value[i] == 0)
		{
			cGUID.Data1 = strtoul (value + 1, NULL, 16);
			cGUID.Data2 = (WORD)strtoul (value + 10, NULL, 16);
			cGUID.Data3 = (WORD)strtoul (value + 15, NULL, 16);
			cGUID.Data4[0] = HexToByte (value + 20);
			cGUID.Data4[1] = HexToByte (value + 22);
			cGUID.Data4[2] = HexToByte (value + 25);
			cGUID.Data4[3] = HexToByte (value + 27);
			cGUID.Data4[4] = HexToByte (value + 29);
			cGUID.Data4[5] = HexToByte (value + 31);
			cGUID.Data4[6] = HexToByte (value + 33);
			cGUID.Data4[7] = HexToByte (value + 35);
			ret.pGUID = &cGUID;
		}
		break;

	default:
		break;
	}

	return ret;
}